

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void kahanBabuskaNeumaierStepInt64(SumCtx *pSum,i64 iVal)

{
  ulong uVar1;
  
  if (iVal + 0xfff0000000000000U < 0xffe0000000000001) {
    uVar1 = iVal + 0x3fff;
    if (-1 < iVal) {
      uVar1 = iVal;
    }
    iVal = iVal % 0x4000;
    kahanBabuskaNeumaierStep(pSum,(double)(long)(uVar1 & 0xffffffffffffc000));
  }
  kahanBabuskaNeumaierStep(pSum,(double)iVal);
  return;
}

Assistant:

static void kahanBabuskaNeumaierStepInt64(volatile SumCtx *pSum, i64 iVal){
  if( iVal<=-4503599627370496LL || iVal>=+4503599627370496LL ){
    i64 iBig, iSm;
    iSm = iVal % 16384;
    iBig = iVal - iSm;
    kahanBabuskaNeumaierStep(pSum, iBig);
    kahanBabuskaNeumaierStep(pSum, iSm);
  }else{
    kahanBabuskaNeumaierStep(pSum, (double)iVal);
  }
}